

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O1

fstream * __thiscall
SharedDirectory::open_readable_file
          (fstream *__return_storage_ptr__,SharedDirectory *this,string *name)

{
  pointer pcVar1;
  bool bVar2;
  Error *this_00;
  string local_60;
  path local_40;
  
  bVar2 = can_read_file(this,name);
  if (bVar2) {
    pcVar1 = (name->_M_dataplus)._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + name->_M_string_length);
    path_in_dir(&local_40,this,&local_60);
    boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
              (__return_storage_ptr__,&local_40,_S_in);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_pathname._M_dataplus._M_p != &local_40.m_pathname.field_2) {
      operator_delete(local_40.m_pathname._M_dataplus._M_p,
                      local_40.m_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x3f0);
  Error::Error(this_00,"File does not exist");
  __cxa_throw(this_00,&Error::typeinfo,std::exception::~exception);
}

Assistant:

boost::filesystem::fstream SharedDirectory::open_readable_file(const std::string &name) {
  if (!can_read_file(name)) {
    throw Error("File does not exist");
  }
  return fstream(path_in_dir(name), std::ios::in);
}